

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

int __thiscall Layer_c_api::forward(Layer_c_api *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  int ret;
  ncnn_mat_t top_blob0;
  undefined4 in_stack_ffffffffffffffd0;
  Mat *this_00;
  
  this_00 = (Mat *)0x0;
  iVar1 = (**(code **)(*(long *)(in_RDI + 0xd0) + 0x28))
                    (*(undefined8 *)(in_RDI + 0xd0),in_RSI,&stack0xffffffffffffffd8,in_RCX);
  ncnn::Mat::operator=(this_00,(Mat *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  ncnn_mat_destroy((ncnn_mat_t)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  return iVar1;
}

Assistant:

virtual int forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
    {
        ncnn_mat_t top_blob0 = 0;
        int ret = layer->forward_1(layer, (ncnn_mat_t)&bottom_blob, &top_blob0, (ncnn_option_t)&opt);
        top_blob = *(Mat*)top_blob0;
        ncnn_mat_destroy(top_blob0);
        return ret;
    }